

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall xLearn::Reader::SetBlockSize(Reader *this,size_t size)

{
  ostream *poVar1;
  allocator local_4e;
  allocator local_4d;
  Logger local_4c;
  string local_48;
  string local_28;
  
  if (size != 0) {
    this->block_size_ = size;
    return;
  }
  local_4c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.h"
             ,&local_4d);
  std::__cxx11::string::string((string *)&local_48,"SetBlockSize",&local_4e);
  poVar1 = Logger::Start(ERR,&local_28,0x6c,&local_48);
  poVar1 = std::operator<<(poVar1,"CHECK_GT failed ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.h"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x6c);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"size");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"0");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  Logger::~Logger(&local_4c);
  abort();
}

Assistant:

inline void SetBlockSize(size_t size) { 
    CHECK_GT(size, 0);
    block_size_ = size; 
  }